

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase71::run(TestCase71 *this)

{
  TestCase71 *this_local;
  
  (anonymous_namespace)::assertSameType<unsigned_char,unsigned_char>();
  (anonymous_namespace)::assertSameType<unsigned_char,unsigned_char>();
  (anonymous_namespace)::assertSameType<unsigned_char,unsigned_char>();
  (anonymous_namespace)::assertSameType<unsigned_char,unsigned_char>();
  (anonymous_namespace)::assertSameType<unsigned_char,unsigned_char>();
  (anonymous_namespace)::assertSameType<unsigned_char,unsigned_char>();
  (anonymous_namespace)::assertSameType<unsigned_char,unsigned_char>();
  (anonymous_namespace)::assertSameType<unsigned_short,unsigned_short>();
  (anonymous_namespace)::assertSameType<unsigned_short,unsigned_short>();
  (anonymous_namespace)::assertSameType<unsigned_short,unsigned_short>();
  (anonymous_namespace)::assertSameType<unsigned_short,unsigned_short>();
  (anonymous_namespace)::assertSameType<unsigned_int,unsigned_int>();
  (anonymous_namespace)::assertSameType<unsigned_int,unsigned_int>();
  (anonymous_namespace)::assertSameType<unsigned_int,unsigned_int>();
  (anonymous_namespace)::assertSameType<unsigned_int,unsigned_int>();
  (anonymous_namespace)::assertSameType<unsigned_int,unsigned_int>();
  (anonymous_namespace)::assertSameType<unsigned_long,unsigned_long>();
  (anonymous_namespace)::assertSameType<unsigned_long,unsigned_long>();
  (anonymous_namespace)::assertSameType<unsigned_long,unsigned_long>();
  (anonymous_namespace)::assertSameType<unsigned_long,unsigned_long>();
  (anonymous_namespace)::assertSameType<unsigned_long,unsigned_long>();
  (anonymous_namespace)::assertSameType<unsigned_long,unsigned_long>();
  (anonymous_namespace)::assertSameType<unsigned_long,unsigned_long>();
  return;
}

Assistant:

TEST(UnitMeasure, AtLeastUInt) {
  assertSameType<uint8_t , AtLeastUInt< 2>>();
  assertSameType<uint8_t , AtLeastUInt< 3>>();
  assertSameType<uint8_t , AtLeastUInt< 4>>();
  assertSameType<uint8_t , AtLeastUInt< 5>>();
  assertSameType<uint8_t , AtLeastUInt< 6>>();
  assertSameType<uint8_t , AtLeastUInt< 7>>();
  assertSameType<uint8_t , AtLeastUInt< 8>>();
  assertSameType<uint16_t, AtLeastUInt< 9>>();
  assertSameType<uint16_t, AtLeastUInt<10>>();
  assertSameType<uint16_t, AtLeastUInt<13>>();
  assertSameType<uint16_t, AtLeastUInt<16>>();
  assertSameType<uint32_t, AtLeastUInt<17>>();
  assertSameType<uint32_t, AtLeastUInt<23>>();
  assertSameType<uint32_t, AtLeastUInt<24>>();
  assertSameType<uint32_t, AtLeastUInt<25>>();
  assertSameType<uint32_t, AtLeastUInt<32>>();
  assertSameType<uint64_t, AtLeastUInt<33>>();
  assertSameType<uint64_t, AtLeastUInt<40>>();
  assertSameType<uint64_t, AtLeastUInt<41>>();
  assertSameType<uint64_t, AtLeastUInt<47>>();
  assertSameType<uint64_t, AtLeastUInt<48>>();
  assertSameType<uint64_t, AtLeastUInt<52>>();
  assertSameType<uint64_t, AtLeastUInt<64>>();

  // COMPILE ERROR: assertSameType<uint64_t, AtLeastUInt<65>>();
}